

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O3

string * escapeForShellOldStyle(string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  char *ch;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    bVar1 = *(byte *)&(str->_M_dataplus)._M_p;
    if (bVar1 == 0x20) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else if (bVar1 == 0) {
      return (string *)(ulong)bVar1;
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    str = (string *)((long)&(str->_M_dataplus)._M_p + 1);
  } while( true );
}

Assistant:

static std::string escapeForShellOldStyle(const std::string& str)
{
  std::string result;
#if defined(_WIN32) && !defined(__CYGWIN__)
  // if there are spaces
  std::string temp = str;
  if (temp.find(" ") != std::string::npos &&
      temp.find("\"") == std::string::npos) {
    result = cmStrCat('"', str, '"');
    return result;
  }
  return str;
#else
  for (const char* ch = str.c_str(); *ch != '\0'; ++ch) {
    if (*ch == ' ') {
      result += '\\';
    }
    result += *ch;
  }
  return result;
#endif
}